

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_complex_add(sexp ctx,sexp a,sexp b)

{
  sexp ctx_00;
  sexp psVar1;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp imag;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp real;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp real_00;
  undefined1 local_48 [24];
  sexp_gc_var_t local_30;
  undefined8 local_20;
  undefined8 local_8;
  
  local_20 = &DAT_0000043e;
  local_8 = in_RDI;
  memset(&local_30,0,0x10);
  local_48._16_8_ = 0x43e;
  memset(local_48,0,0x10);
  memset(&stack0xffffffffffffffa0,0,0x10);
  local_30.var = (sexp_conflict *)&stack0xffffffffffffffe0;
  local_30.next = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = &local_30;
  local_48._0_8_ = local_48 + 0x10;
  local_48._8_8_ = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)local_48;
  psVar1 = (sexp)&stack0xffffffffffffffb0;
  real_00 = (sexp)(((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa0;
  local_48._16_8_ = sexp_add((sexp)__sexp_gc_preserver2.var,imag,(sexp)__sexp_gc_preserver3.next);
  ctx_00 = sexp_add((sexp)__sexp_gc_preserver2.var,imag,(sexp)__sexp_gc_preserver3.next);
  local_20 = sexp_make_complex(ctx_00,real_00,psVar1);
  (((sexp)local_8)->value).context.saves = local_30.next;
  psVar1 = sexp_complex_normalize((sexp)local_20);
  return psVar1;
}

Assistant:

sexp sexp_complex_add (sexp ctx, sexp a, sexp b) {
  sexp_gc_var3(res, real, imag);
  sexp_gc_preserve3(ctx, res, real, imag);
  real = sexp_add(ctx, sexp_complex_real(a), sexp_complex_real(b));
  imag = sexp_add(ctx, sexp_complex_imag(a), sexp_complex_imag(b));
  res = sexp_make_complex(ctx, real, imag);
  sexp_gc_release3(ctx);
  return sexp_complex_normalize(res);
}